

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O3

int If_CutVerifyCuts(If_Set_t *pCutSet,int fOrdered)

{
  If_Cut_t *pCut;
  If_Cut_t *pCut_00;
  uint uVar1;
  uint uVar2;
  long lVar3;
  float fVar4;
  ulong uVar5;
  float *pfVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  
  lVar3 = (long)pCutSet->nCuts;
  if (lVar3 < 1) {
    __assert_fail("pCutSet->nCuts > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifCut.c"
                  ,0x43,"int If_CutVerifyCuts(If_Set_t *, int)");
  }
  lVar10 = 0;
  iVar9 = If_CutVerifyCuts::Count;
  do {
    pCut = pCutSet->ppCuts[lVar10];
    uVar2 = *(uint *)&pCut->field_0x1c;
    uVar12 = 0;
    if (0xffffff < uVar2) {
      uVar5 = 0;
      uVar12 = 0;
      do {
        uVar12 = uVar12 | 1 << (uint)(&pCut[1].Area)[uVar5] % 0x1f;
        uVar5 = uVar5 + 1;
      } while (uVar2 >> 0x18 != uVar5);
    }
    if (pCut->uSign != uVar12) {
      __assert_fail("pCut0->uSign == If_ObjCutSignCompute(pCut0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifCut.c"
                    ,0x47,"int If_CutVerifyCuts(If_Set_t *, int)");
    }
    uVar5 = (ulong)(uVar2 >> 0x18);
    if (fOrdered == 0) {
      if (0xffffff < uVar2) {
        pfVar6 = &pCut[1].Edge;
        uVar11 = 0;
        uVar7 = uVar5;
        do {
          uVar7 = uVar7 - 1;
          uVar13 = uVar11 + 1;
          if (uVar13 < uVar5) {
            uVar8 = 0;
            do {
              if ((&pCut[1].Area)[uVar11] == pfVar6[uVar8]) {
                __assert_fail("pCut0->pLeaves[m] != pCut0->pLeaves[n]",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifCut.c"
                              ,0x53,"int If_CutVerifyCuts(If_Set_t *, int)");
              }
              uVar8 = uVar8 + 1;
            } while (uVar7 != uVar8);
          }
          pfVar6 = pfVar6 + 1;
          uVar11 = uVar13;
        } while (uVar13 != uVar5);
      }
    }
    else if (0x1ffffff < uVar2) {
      lVar14 = 0;
      fVar4 = pCut[1].Area;
      do {
        pfVar6 = &pCut[1].Edge + lVar14;
        if ((int)*pfVar6 <= (int)fVar4) {
          __assert_fail("pCut0->pLeaves[m-1] < pCut0->pLeaves[m]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifCut.c"
                        ,0x4c,"int If_CutVerifyCuts(If_Set_t *, int)");
        }
        lVar14 = lVar14 + 1;
        fVar4 = *pfVar6;
      } while (uVar5 - 1 != lVar14);
    }
    lVar14 = 0;
    do {
      pCut_00 = pCutSet->ppCuts[lVar14];
      if (pCut != pCut_00) {
        iVar9 = iVar9 + 1;
        uVar12 = *(uint *)&pCut_00->field_0x1c;
        If_CutVerifyCuts::Count = iVar9;
        if (uVar12 < 0x1000000) {
LAB_008cbe8a:
          uVar1 = 0;
          if (0xffffff < uVar2) {
            uVar5 = 0;
            uVar1 = 0;
            do {
              uVar1 = uVar1 | 1 << (uint)(&pCut[1].Area)[uVar5] % 0x1f;
              uVar5 = uVar5 + 1;
            } while (uVar2 >> 0x18 != uVar5);
          }
          if (pCut->uSign != uVar1) {
            __assert_fail("pCut0->uSign == If_ObjCutSignCompute(pCut0)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifCut.c"
                          ,0x61,"int If_CutVerifyCuts(If_Set_t *, int)");
          }
          uVar2 = 0;
          if (0xffffff < uVar12) {
            uVar5 = 0;
            uVar2 = 0;
            do {
              uVar2 = uVar2 | 1 << (uint)(&pCut_00[1].Area)[uVar5] % 0x1f;
              uVar5 = uVar5 + 1;
            } while (uVar12 >> 0x18 != uVar5);
          }
          if (pCut_00->uSign != uVar2) {
            __assert_fail("pCut1->uSign == If_ObjCutSignCompute(pCut1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifCut.c"
                          ,0x62,"int If_CutVerifyCuts(If_Set_t *, int)");
          }
          If_CutPrint(pCut);
          If_CutPrint(pCut_00);
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifCut.c"
                        ,0x65,"int If_CutVerifyCuts(If_Set_t *, int)");
        }
        uVar7 = 0;
        while( true ) {
          uVar11 = 0;
          if (0xffffff < uVar2) {
            uVar11 = 0;
            while ((&pCut_00[1].Area)[uVar7] != (&pCut[1].Area)[uVar11]) {
              uVar11 = uVar11 + 1;
              if (uVar5 == uVar11) goto LAB_008cbe43;
            }
          }
          if ((uint)uVar11 == uVar2 >> 0x18) break;
          uVar7 = uVar7 + 1;
          if (uVar7 == uVar12 >> 0x18) goto LAB_008cbe8a;
        }
      }
LAB_008cbe43:
      lVar14 = lVar14 + 1;
    } while (lVar14 != lVar3);
    lVar10 = lVar10 + 1;
    if (lVar10 == lVar3) {
      return 1;
    }
  } while( true );
}

Assistant:

int If_CutVerifyCuts( If_Set_t * pCutSet, int fOrdered )
{
    static int Count = 0;
    If_Cut_t * pCut0, * pCut1; 
    int i, k, m, n, Value;
    assert( pCutSet->nCuts > 0 );
    for ( i = 0; i < pCutSet->nCuts; i++ )
    {
        pCut0 = pCutSet->ppCuts[i];
        assert( pCut0->uSign == If_ObjCutSignCompute(pCut0) );
        if ( fOrdered )
        {
            // check duplicates
            for ( m = 1; m < (int)pCut0->nLeaves; m++ )
                assert( pCut0->pLeaves[m-1] < pCut0->pLeaves[m] );
        }
        else
        {
            // check duplicates
            for ( m = 0; m < (int)pCut0->nLeaves; m++ )
            for ( n = m+1; n < (int)pCut0->nLeaves; n++ )
            assert( pCut0->pLeaves[m] != pCut0->pLeaves[n] );
        }
        // check pairs
        for ( k = 0; k < pCutSet->nCuts; k++ )
        {
            pCut1 = pCutSet->ppCuts[k];
            if ( pCut0 == pCut1 )
                continue;
            Count++;
            // check containments
            Value = If_CutVerifyCut( pCut0, pCut1 );
//            assert( Value == 0 );
            if ( Value )
            {
                assert( pCut0->uSign == If_ObjCutSignCompute(pCut0) );
                assert( pCut1->uSign == If_ObjCutSignCompute(pCut1) );
                If_CutPrint( pCut0 );
                If_CutPrint( pCut1 );
                assert( 0 );
            }
        }
    }
    return 1;
}